

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

bool __thiscall cfd::core::Psbt::IsFindGlobalXpubkey(Psbt *this,ExtPubkey *key)

{
  wally_psbt *psbt;
  bool bVar1;
  bool is_find;
  uint8_t xpub_key;
  ByteData key_data;
  ByteData key_top;
  bool local_72;
  uint8_t local_71;
  ByteData local_70;
  ByteData local_58;
  ByteData local_40;
  ByteData local_28;
  
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  local_72 = false;
  local_71 = '\x01';
  ByteData::ByteData(&local_40,&local_71,1);
  ExtPubkey::GetData(&local_70,key);
  ByteData::Concat<cfd::core::ByteData>(&local_58,&local_40,&local_70);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  GetPsbtGlobal(&local_28,&local_58,psbt,&local_72);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar1 = local_72;
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool Psbt::IsFindGlobalXpubkey(const ExtPubkey &key) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  bool is_find = false;
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetData());
  GetPsbtGlobal(key_data, psbt_pointer, &is_find);
  return is_find;
}